

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O1

void __thiscall restincurl::Worker::CloseWhenFinished(Worker *this)

{
  Request *pRVar1;
  uint uVar2;
  ulong uVar3;
  undefined1 *in_RSI;
  ulong *puVar4;
  char *this_00;
  ulong __n;
  undefined1 auVar5 [16];
  ulong uStack_40;
  Worker *pWStack_38;
  
  uVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
  if (uVar2 == 0) {
    this->close_pending_ = true;
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
    Signaler::Signal(&this->signal_);
    return;
  }
  puVar4 = (ulong *)(ulong)uVar2;
  auVar5 = std::__throw_system_error(uVar2);
  uStack_40 = auVar5._0_8_;
  pWStack_38 = this;
  if (auVar5._8_8_ == 0 || in_RSI != (undefined1 *)0x0) {
    __n = auVar5._8_8_ - (long)in_RSI;
    uStack_40 = __n;
    if (0xf < __n) {
      uVar3 = std::__cxx11::string::_M_create(puVar4,(ulong)&uStack_40);
      *puVar4 = uVar3;
      puVar4[2] = uStack_40;
    }
    if (__n != 0) {
      if (__n == 1) {
        *(undefined1 *)*puVar4 = *in_RSI;
      }
      else {
        memcpy((undefined1 *)*puVar4,in_RSI,__n);
      }
    }
    puVar4[1] = uStack_40;
    *(undefined1 *)(*puVar4 + uStack_40) = 0;
    return;
  }
  this_00 = "basic_string::_M_construct null not valid";
  std::__throw_logic_error("basic_string::_M_construct null not valid");
  pRVar1 = (((unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_> *)
            ((long)this_00 + 0x48))->_M_t).
           super___uniq_ptr_impl<restincurl::Request,_std::default_delete<restincurl::Request>_>.
           _M_t.
           super__Tuple_impl<0UL,_restincurl::Request_*,_std::default_delete<restincurl::Request>_>.
           super__Head_base<0UL,_restincurl::Request_*,_false>._M_head_impl;
  if (pRVar1 != (Request *)0x0) {
    (*(code *)pRVar1)((unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_> *)
                      ((long)this_00 + 0x38),
                      (unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_> *)
                      ((long)this_00 + 0x38),3);
  }
  pRVar1 = (((unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_> *)
            ((long)this_00 + 0x10))->_M_t).
           super___uniq_ptr_impl<restincurl::Request,_std::default_delete<restincurl::Request>_>.
           _M_t.
           super__Tuple_impl<0UL,_restincurl::Request_*,_std::default_delete<restincurl::Request>_>.
           super__Head_base<0UL,_restincurl::Request_*,_false>._M_head_impl;
  if (pRVar1 != (Request *)((long)this_00 + 0x20)) {
    operator_delete(pRVar1,(long)(((Request *)((long)this_00 + 0x20))->eh_)._M_t.
                                 super___uniq_ptr_impl<restincurl::EasyHandle,_std::default_delete<restincurl::EasyHandle>_>
                           + 1);
  }
  pRVar1 = (((unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_> *)
            ((long)this_00 + 8))->_M_t).
           super___uniq_ptr_impl<restincurl::Request,_std::default_delete<restincurl::Request>_>.
           _M_t.
           super__Tuple_impl<0UL,_restincurl::Request_*,_std::default_delete<restincurl::Request>_>.
           super__Head_base<0UL,_restincurl::Request_*,_false>._M_head_impl;
  if (pRVar1 != (Request *)0x0) {
    operator_delete(pRVar1,8);
  }
  (((unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_> *)
   ((long)this_00 + 8))->_M_t).
  super___uniq_ptr_impl<restincurl::Request,_std::default_delete<restincurl::Request>_>._M_t.
  super__Tuple_impl<0UL,_restincurl::Request_*,_std::default_delete<restincurl::Request>_>.
  super__Head_base<0UL,_restincurl::Request_*,_false>._M_head_impl = (Request *)0x0;
  std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>::~unique_ptr
            ((unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_> *)this_00);
  return;
}

Assistant:

void CloseWhenFinished() {
            {
                lock_t lock(mutex_);
                close_pending_ = true;
            }
            Signal();
        }